

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

t_debug_script * __thiscall
anon_unknown.dwarf_2b0a42::t_debugger::f_find_module(t_debugger *this,wstring_view a_path)

{
  bool bVar1;
  map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>_>
  *this_00;
  reference ppVar2;
  t_object *ptVar3;
  t_module *ptVar4;
  t_body *ptVar5;
  __sv_type __y;
  t_debug_script *local_88;
  t_debug_script *debug;
  t_slot *body;
  pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>
  *pair;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>_>
  *__range2;
  t_debugger *this_local;
  wstring_view a_path_local;
  
  this_00 = xemmai::t_engine::f_modules_abi_cxx11_(this->v_engine);
  __end2 = std::
           map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>_>
           ::begin(this_00);
  pair = (pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>
          *)std::
            map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>_>
            ::end(this_00);
  do {
    bVar1 = std::operator==(&__end2,(_Self *)&pair);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (t_debug_script *)0x0;
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>
             ::operator*(&__end2);
    ptVar3 = xemmai::t_slot::operator->(&ppVar2->second);
    ptVar4 = xemmai::t_object::f_as<xemmai::t_module>(ptVar3);
    ptVar3 = xemmai::t_slot::operator_cast_to_t_object_(&ptVar4->v_body);
    if (ptVar3 != (t_object *)0x0) {
      ptVar3 = xemmai::t_slot::operator->(&ptVar4->v_body);
      ptVar5 = xemmai::t_object::f_as<xemmai::t_module::t_body>(ptVar3);
      if (ptVar5 == (t_body *)0x0) {
        local_88 = (t_debug_script *)0x0;
      }
      else {
        local_88 = (t_debug_script *)
                   __dynamic_cast(ptVar5,&xemmai::t_module::t_body::typeinfo,
                                  &xemmai::t_debug_script::typeinfo,0);
      }
      if (local_88 != (t_debug_script *)0x0) {
        __y = std::__cxx11::wstring::operator_cast_to_basic_string_view
                        ((wstring *)&(local_88->super_t_script).v_path);
        bVar1 = std::operator==(a_path,__y);
        if (bVar1) {
          return local_88;
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_xemmai::t_slot>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

t_debug_script* f_find_module(std::wstring_view a_path)
	{
		for (auto& pair : v_engine.f_modules()) {
			auto& body = pair.second->f_as<t_module>().v_body;
			if (!body) continue;
			auto debug = dynamic_cast<t_debug_script*>(&body->f_as<t_module::t_body>());
			if (debug && debug->v_path == a_path) return debug;
		}
		return nullptr;
	}